

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MotorVoltage.cpp
# Opt level: O2

double MeasureMotorSupplyVoltage(BasePort *curPort,AmpIO *curBoard,uint index)

{
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)curBoard);
  if (uVar2 < 8) {
    return 0.0;
  }
  (*curPort->_vptr_BasePort[0x1d])(curPort);
  bVar1 = AmpIO::IsQLAExpanded(curBoard,index);
  if (bVar1) {
    AmpIO::WriteSafetyRelay(curBoard,true);
    AmpIO::WritePowerEnable(curBoard,true);
    uVar5 = 0;
    AmpIO::WriteAmpEnable(curBoard,0xff,0);
    Amp1394_Sleep(1.0);
    bVar1 = AmpIO::ReadPowerStatus(curBoard,0);
    if (bVar1) {
      lVar7 = (ulong)(index == 2) * 0x40 + 0x41;
      uVar6 = 0x1000;
      for (; uVar5 < 0x10000; uVar5 = uVar5 + uVar6) {
        (*curPort->_vptr_BasePort[0x24])
                  (curPort,(ulong)(curBoard->super_FpgaIO).super_BoardIO.BoardId,lVar7,
                   (ulong)(uVar5 | 0x80000000));
        Amp1394_Sleep(0.001);
        bVar1 = AmpIO::ReadMotorSupplyVoltageBit(curBoard,index);
        if (!bVar1) {
          if (uVar6 < 2) break;
          uVar5 = uVar5 - uVar6;
          uVar6 = uVar6 >> 1;
        }
      }
      (*curPort->_vptr_BasePort[0x24])
                (curPort,(ulong)(curBoard->super_FpgaIO).super_BoardIO.BoardId,lVar7,0x80008000);
      AmpIO::WritePowerEnable(curBoard,false);
      if (0xffff < uVar5) {
        return 0.0;
      }
      return (double)(int)uVar5 * 0.0008010986495765621;
    }
    pcVar4 = "MeasureMotorSupplyVoltage: motor supply not enabled, check safety circuit";
  }
  else {
    pcVar4 = "MeasureMotorSupplyVoltage: QLA does not support voltage measurement";
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  return 0.0;
}

Assistant:

double MeasureMotorSupplyVoltage(BasePort *curPort, AmpIO *curBoard, unsigned int index)
{
    // Firmware version must be >= 8
    if (curBoard->GetFirmwareVersion() < 8)
        return 0.0;

    // QLA IO expander must be present (QLA 1.5+)
    curPort->ReadAllBoards();
    if (!curBoard->IsQLAExpanded(index)) {
        std::cerr << "MeasureMotorSupplyVoltage: QLA does not support voltage measurement" << std::endl;
        return 0.0;
    }

    // Make sure board power is on and amplifier power is off
    curBoard->WriteSafetyRelay(true);
    curBoard->WritePowerEnable(true);
    curBoard->WriteAmpEnable(0xff, 0);
    Amp1394_Sleep(1.0);
    if (!curBoard->ReadPowerStatus()) {
        std::cerr << "MeasureMotorSupplyVoltage: motor supply not enabled, check safety circuit" << std::endl;
        return 0.0;
    }

    double V = 0.0;    // Measured voltage (in volts)
    uint32_t volts;    // Measured voltage (in bits)
    uint32_t vinc = 0x1000;
    nodeaddr_t dac_addr = (index == 2) ? 0x81 : 0x41;
    for (volts = 0; volts <= 0x0000ffff; volts += vinc) {
        // Write voltage to DAC 4 or 8 (for DQLA)
        curPort->WriteQuadlet(curBoard->GetBoardId(), dac_addr, volts | 0x80000000);
        Amp1394_Sleep(0.001);
        bool dac_lt_supply = curBoard->ReadMotorSupplyVoltageBit(index);
        if (!dac_lt_supply) {
            // if DAC voltage greater than supply,
            // backup and reduce resolution
            if (vinc <= 1) break;
            volts -= vinc;
            vinc >>= 1;
        }
    }
    curPort->WriteQuadlet(curBoard->GetBoardId(), dac_addr, 0x80008000);
    curBoard->WritePowerEnable(false);
    if (volts <= 0x0000ffff)
        V = volts*bits2volts;
    return V;
}